

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

TransliteratorEntry *
icu_63::TransliteratorRegistry::findInBundle
          (TransliteratorSpec *specToOpen,TransliteratorSpec *specToFind,UnicodeString *variant,
          UTransDirection direction)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString *pUVar3;
  TransliteratorSpec *pTVar4;
  CharString *pCVar5;
  char *pcVar6;
  Locale *locale;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t __length_00;
  __off_t extraout_RDX_00;
  undefined1 *p;
  UTransDirection local_3c4;
  TransliteratorSpec *local_3b8;
  int32_t dir;
  TransliteratorEntry *entry;
  CharString local_2d8;
  undefined1 local_298 [144];
  ResourceBundle subres;
  undefined1 local_1f0 [4];
  UErrorCode status;
  undefined1 local_110 [8];
  UnicodeString s;
  ConstChar16Ptr local_c8;
  int local_c0;
  int32_t pass;
  undefined1 local_b0 [8];
  UnicodeString resStr;
  UnicodeString utag;
  UTransDirection direction_local;
  UnicodeString *variant_local;
  TransliteratorSpec *specToFind_local;
  TransliteratorSpec *specToOpen_local;
  
  pTVar4 = specToFind;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)((long)&resStr.fUnion + 0x30));
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_b0);
  __length = extraout_RDX;
  for (local_c0 = 0; local_c0 < 2; local_c0 = local_c0 + 1) {
    icu_63::UnicodeString::truncate
              ((UnicodeString *)((long)&resStr.fUnion + 0x30),(char *)0x0,__length);
    if (local_c0 == 0) {
      p = TRANSLITERATE_FROM;
      if (direction == UTRANS_FORWARD) {
        p = TRANSLITERATE_TO;
      }
      ConstChar16Ptr::ConstChar16Ptr(&local_c8,(char16_t *)p);
      icu_63::UnicodeString::append((UnicodeString *)((long)&resStr.fUnion + 0x30),&local_c8,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_c8);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr
                ((ConstChar16Ptr *)((long)&s.fUnion + 0x30),(char16_t *)TRANSLITERATE);
      icu_63::UnicodeString::append
                ((UnicodeString *)((long)&resStr.fUnion + 0x30),
                 (ConstChar16Ptr *)((long)&s.fUnion + 0x30),-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)((long)&s.fUnion + 0x30));
    }
    pUVar3 = TransliteratorSpec::get(specToFind);
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_110,pUVar3);
    Locale::Locale((Locale *)local_1f0,"",(char *)0x0,(char *)0x0,(char *)0x0);
    pUVar3 = icu_63::UnicodeString::toUpper((UnicodeString *)local_110,(Locale *)local_1f0);
    icu_63::UnicodeString::append((UnicodeString *)((long)&resStr.fUnion + 0x30),pUVar3);
    Locale::~Locale((Locale *)local_1f0);
    subres.fLocale._4_4_ = U_ZERO_ERROR;
    pTVar4 = (TransliteratorSpec *)TransliteratorSpec::getBundle(specToOpen);
    CharString::CharString((CharString *)(local_298 + 0x48));
    pCVar5 = CharString::appendInvariantChars
                       ((CharString *)(local_298 + 0x48),
                        (UnicodeString *)((long)&resStr.fUnion + 0x30),
                        (UErrorCode *)((long)&subres.fLocale + 4));
    pcVar6 = CharString::data(pCVar5);
    ResourceBundle::get((ResourceBundle *)(local_298 + 0x88),(ResourceBundle *)pTVar4,pcVar6,
                        (UErrorCode *)((long)&subres.fLocale + 4));
    CharString::~CharString((CharString *)(local_298 + 0x48));
    UVar1 = ::U_FAILURE(subres.fLocale._4_4_);
    if ((UVar1 == '\0') && (subres.fLocale._4_4_ != U_USING_DEFAULT_WARNING)) {
      icu_63::UnicodeString::truncate((UnicodeString *)local_110,(char *)0x0,__length_00);
      pUVar3 = TransliteratorSpec::get(specToOpen);
      locale = ResourceBundle::getLocale((ResourceBundle *)(local_298 + 0x88));
      pTVar4 = (TransliteratorSpec *)
               LocaleUtility::initNameFromLocale(locale,(UnicodeString *)local_110);
      UVar1 = icu_63::UnicodeString::operator!=(pUVar3,(UnicodeString *)pTVar4);
      if (UVar1 == '\0') {
        iVar2 = icu_63::UnicodeString::length(variant);
        if (iVar2 == 0) {
          subres.fLocale._4_4_ = U_ZERO_ERROR;
          ResourceBundle::getStringEx
                    ((UnicodeString *)&entry,(ResourceBundle *)(local_298 + 0x88),1,
                     (UErrorCode *)((long)&subres.fLocale + 4));
          pTVar4 = (TransliteratorSpec *)&entry;
          icu_63::UnicodeString::operator=((UnicodeString *)local_b0,(UnicodeString *)&entry);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&entry);
          UVar1 = ::U_SUCCESS(subres.fLocale._4_4_);
          if (UVar1 == '\0') goto LAB_002e972e;
          local_298._68_4_ = 2;
        }
        else {
          subres.fLocale._4_4_ = U_ZERO_ERROR;
          CharString::CharString(&local_2d8);
          pCVar5 = CharString::appendInvariantChars
                             (&local_2d8,variant,(UErrorCode *)((long)&subres.fLocale + 4));
          pcVar6 = CharString::data(pCVar5);
          ResourceBundle::getStringEx
                    ((UnicodeString *)local_298,(ResourceBundle *)(local_298 + 0x88),pcVar6,
                     (UErrorCode *)((long)&subres.fLocale + 4));
          pTVar4 = (TransliteratorSpec *)local_298;
          icu_63::UnicodeString::operator=((UnicodeString *)local_b0,(UnicodeString *)local_298);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_298);
          CharString::~CharString(&local_2d8);
          UVar1 = ::U_SUCCESS(subres.fLocale._4_4_);
          if (UVar1 == '\0') {
LAB_002e972e:
            local_298._68_4_ = 0;
          }
          else {
            local_298._68_4_ = 2;
          }
        }
      }
      else {
        local_298._68_4_ = 4;
      }
    }
    else {
      local_298._68_4_ = 4;
    }
    ResourceBundle::~ResourceBundle((ResourceBundle *)(local_298 + 0x88));
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_110);
    if ((local_298._68_4_ != 0) && (local_298._68_4_ == 2)) break;
    __length = extraout_RDX_00;
  }
  if (local_c0 == 2) {
    specToOpen_local = (TransliteratorSpec *)0x0;
  }
  else {
    pTVar4 = (TransliteratorSpec *)UMemory::operator_new((UMemory *)0x68,(size_t)pTVar4);
    local_3b8 = (TransliteratorSpec *)0x0;
    if (pTVar4 != (TransliteratorSpec *)0x0) {
      TransliteratorEntry::TransliteratorEntry((TransliteratorEntry *)pTVar4);
      local_3b8 = pTVar4;
    }
    if (local_3b8 != (TransliteratorSpec *)0x0) {
      local_3c4 = direction;
      if (local_c0 == 0) {
        local_3c4 = UTRANS_FORWARD;
      }
      *(undefined4 *)local_3b8 = 2;
      icu_63::UnicodeString::operator=(&local_3b8->top,(UnicodeString *)local_b0);
      *(UTransDirection *)&(local_3b8->spec).super_Replaceable.super_UObject._vptr_UObject =
           local_3c4;
    }
    specToOpen_local = local_3b8;
  }
  local_298._68_4_ = 1;
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&resStr.fUnion + 0x30));
  return (TransliteratorEntry *)specToOpen_local;
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::findInBundle(const TransliteratorSpec& specToOpen,
                                            const TransliteratorSpec& specToFind,
                                            const UnicodeString& variant,
                                            UTransDirection direction)
{
    UnicodeString utag;
    UnicodeString resStr;
    int32_t pass;

    for (pass=0; pass<2; ++pass) {
        utag.truncate(0);
        // First try either TransliteratorTo_xxx or
        // TransliterateFrom_xxx, then try the bidirectional
        // Transliterate_xxx.  This precedence order is arbitrary
        // but must be consistent and documented.
        if (pass == 0) {
            utag.append(direction == UTRANS_FORWARD ?
                        TRANSLITERATE_TO : TRANSLITERATE_FROM, -1);
        } else {
            utag.append(TRANSLITERATE, -1);
        }
        UnicodeString s(specToFind.get());
        utag.append(s.toUpper(""));
        UErrorCode status = U_ZERO_ERROR;
        ResourceBundle subres(specToOpen.getBundle().get(
            CharString().appendInvariantChars(utag, status).data(), status));
        if (U_FAILURE(status) || status == U_USING_DEFAULT_WARNING) {
            continue;
        }

        s.truncate(0);
        if (specToOpen.get() != LocaleUtility::initNameFromLocale(subres.getLocale(), s)) {
            continue;
        }

        if (variant.length() != 0) {
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(
                CharString().appendInvariantChars(variant, status).data(), status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        } else {
            // Variant is empty, which means match the first variant listed.
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(1, status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        }
    }

    if (pass==2) {
        // Failed
        return NULL;
    }

    // We have succeeded in loading a string from the locale
    // resources.  Create a new registry entry to hold it and return it.
    TransliteratorEntry *entry = new TransliteratorEntry();
    if (entry != 0) {
        // The direction is always forward for the
        // TransliterateTo_xxx and TransliterateFrom_xxx
        // items; those are unidirectional forward rules.
        // For the bidirectional Transliterate_xxx items,
        // the direction is the value passed in to this
        // function.
        int32_t dir = (pass == 0) ? UTRANS_FORWARD : direction;
        entry->entryType = TransliteratorEntry::LOCALE_RULES;
        entry->stringArg = resStr;
        entry->intArg = dir;
    }

    return entry;
}